

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O2

void __thiscall cmStateDirectory::ComputeRelativePathTopBinary(cmStateDirectory *this)

{
  pointer pcVar1;
  bool bVar2;
  PointerType pBVar3;
  cmStateSnapshot *snp;
  cmStateSnapshot *this_00;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> snapshots;
  undefined1 local_b0 [40];
  string result;
  cmStateSnapshot snapshot;
  string currentBinary;
  
  snapshot.Position.Position = (this->Snapshot_).Position.Position;
  snapshot.State = (this->Snapshot_).State;
  snapshot.Position.Tree = (this->Snapshot_).Position.Tree;
  snapshots.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  snapshots.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  snapshots.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::push_back(&snapshots,&snapshot);
  while( true ) {
    cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)local_b0,&snapshot);
    snapshot.Position.Position = local_b0._16_8_;
    snapshot.State = (cmState *)local_b0._0_8_;
    snapshot.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_b0._8_8_;
    bVar2 = cmStateSnapshot::IsValid(&snapshot);
    if (!bVar2) break;
    std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::push_back(&snapshots,&snapshot);
  }
  cmStateSnapshot::GetDirectory
            ((cmStateDirectory *)local_b0,
             snapshots.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl
             .super__Vector_impl_data._M_start);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_b0);
  std::__cxx11::string::string((string *)&result,(string *)&pBVar3->OutputLocation);
  pcVar1 = snapshots.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = snapshots.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
            super__Vector_impl_data._M_start;
  while (this_00 = this_00 + 1, this_00 != pcVar1) {
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_b0,this_00);
    pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       ((iterator *)local_b0);
    std::__cxx11::string::string((string *)&currentBinary,(string *)&pBVar3->OutputLocation);
    bVar2 = cmsys::SystemTools::IsSubDirectory(&result,&currentBinary);
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)&result);
    }
    std::__cxx11::string::~string((string *)&currentBinary);
  }
  if (1 < result._M_string_length) {
    std::__cxx11::string::substr((ulong)local_b0,(ulong)&result);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b0,"//");
    std::__cxx11::string::~string((string *)local_b0);
    if (!bVar2) {
      pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                         (&this->DirectoryState);
      (pBVar3->RelativePathTopBinary)._M_string_length = 0;
      *(pBVar3->RelativePathTopBinary)._M_dataplus._M_p = '\0';
      goto LAB_001c0751;
    }
  }
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  std::__cxx11::string::_M_assign((string *)&pBVar3->RelativePathTopBinary);
LAB_001c0751:
  std::__cxx11::string::~string((string *)&result);
  std::_Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~_Vector_base
            (&snapshots.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>);
  return;
}

Assistant:

void cmStateDirectory::ComputeRelativePathTopBinary()
{
  cmStateSnapshot snapshot = this->Snapshot_;
  std::vector<cmStateSnapshot> snapshots;
  snapshots.push_back(snapshot);
  while (true) {
    snapshot = snapshot.GetBuildsystemDirectoryParent();
    if (snapshot.IsValid()) {
      snapshots.push_back(snapshot);
    } else {
      break;
    }
  }

  std::string result = snapshots.front().GetDirectory().GetCurrentBinary();

  for (cmStateSnapshot const& snp : cmMakeRange(snapshots).advance(1)) {
    std::string currentBinary = snp.GetDirectory().GetCurrentBinary();
    if (cmSystemTools::IsSubDirectory(result, currentBinary)) {
      result = currentBinary;
    }
  }

  // The current working directory on Windows cannot be a network
  // path.  Therefore relative paths cannot work when the binary tree
  // is a network path.
  if (result.size() < 2 || result.substr(0, 2) != "//") {
    this->DirectoryState->RelativePathTopBinary = result;
  } else {
    this->DirectoryState->RelativePathTopBinary.clear();
  }
}